

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

int __thiscall re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,int flag,char *p)

{
  Inst *this_00;
  char **dst;
  char *pcVar1;
  bool bVar2;
  pointer pIVar3;
  ostream *poVar4;
  Thread *t;
  uint uVar5;
  pointer pIVar6;
  LogMessageFatal local_1b0;
  
  nextq->size_ = 0;
  pIVar3 = (runq->dense_).
           super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar6 = pIVar3;
  do {
    if (pIVar6 == pIVar3 + runq->size_) goto LAB_0012e580;
    t = pIVar6->second;
    if (t != (Thread *)0x0) {
      if (((this->longest_ != true) || (this->matched_ != true)) || (*t->capture <= *this->match_))
      {
        this_00 = this->prog_->inst_ + pIVar6->index_;
        uVar5 = this_00->out_opcode_ & 7;
        if (uVar5 == 1) {
          if ((pIVar6 == pIVar3) &&
             ((bVar2 = Prog::Inst::greedy(this_00,this->prog_), bVar2 || (this->longest_ == true))))
          {
            CopyCapture(this,this->match_,t->capture);
            this->matched_ = true;
            while( true ) {
              Decref(this,t);
              pIVar6 = pIVar6 + 1;
              if (pIVar6 == (runq->dense_).
                            super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                            ._M_impl.super__Vector_impl_data._M_start + runq->size_) break;
              t = pIVar6->second;
            }
            runq->size_ = 0;
            bVar2 = Prog::Inst::greedy(this_00,this->prog_);
            if (bVar2) {
              uVar5 = Prog::Inst::out1(this_00);
            }
            else {
              uVar5 = this_00->out_opcode_ >> 4;
            }
            return uVar5;
          }
        }
        else if (uVar5 == 2) {
          AddToThreadq(this,nextq,this_00->out_opcode_ >> 4,c,flag,p + 1,t);
        }
        else if (uVar5 == 5) {
          if ((this->endmatch_ != true) || (this->etext_ == p)) {
            if (this->longest_ == false) {
              CopyCapture(this,this->match_,t->capture);
              this->match_[1] = p;
              this->matched_ = true;
              while( true ) {
                Decref(this,t);
                pIVar6 = pIVar6 + 1;
                if (pIVar6 == (runq->dense_).
                              super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                              ._M_impl.super__Vector_impl_data._M_start + runq->size_) break;
                t = pIVar6->second;
              }
LAB_0012e580:
              runq->size_ = 0;
              return 0;
            }
            dst = this->match_;
            if (((this->matched_ != true) || (pcVar1 = *t->capture, pcVar1 < *dst)) ||
               ((pcVar1 == *dst && (dst[1] < p)))) {
              CopyCapture(this,dst,t->capture);
              this->match_[1] = p;
              this->matched_ = true;
            }
          }
        }
        else {
          LogMessageFatal::LogMessageFatal
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                     0x15d);
          poVar4 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Unhandled ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,this_00->out_opcode_ & 7);
          std::operator<<(poVar4," in step");
          LogMessageFatal::~LogMessageFatal(&local_1b0);
        }
      }
      Decref(this,t);
    }
    pIVar6 = pIVar6 + 1;
    pIVar3 = (runq->dense_).
             super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
  } while( true );
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, int flag, const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->second;
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, flag, p+1, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->second);
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch:
        if (endmatch_ && p != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->second);
          runq->clear();
          return 0;
        }
        break;
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}